

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O2

void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *stream)

{
  undefined8 *puVar1;
  
  if ((stream->refs).len == 0) {
    __assert_fail("nghttp3_ringbuf_len(&stream->refs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                  ,0x6fa,"void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *)");
  }
  puVar1 = (undefined8 *)nghttp3_ringbuf_get(&stream->refs,0);
  if (((nghttp3_pq_entry *)*puVar1)->index != 0xffffffffffffffff) {
    nghttp3_pq_remove(&stream->max_cnts,(nghttp3_pq_entry *)*puVar1);
    nghttp3_ringbuf_pop_front(&stream->refs);
    return;
  }
  __assert_fail("ref->max_cnts_pe.index != NGHTTP3_PQ_BAD_INDEX",
                "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                ,0x6ff,"void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *)");
}

Assistant:

void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *stream) {
  nghttp3_qpack_header_block_ref *ref;

  assert(nghttp3_ringbuf_len(&stream->refs));

  ref =
    *(nghttp3_qpack_header_block_ref **)nghttp3_ringbuf_get(&stream->refs, 0);

  assert(ref->max_cnts_pe.index != NGHTTP3_PQ_BAD_INDEX);

  nghttp3_pq_remove(&stream->max_cnts, &ref->max_cnts_pe);

  nghttp3_ringbuf_pop_front(&stream->refs);
}